

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void lodepng_state_init(LodePNGState *state)

{
  (state->decoder).read_text_chunks = 1;
  (state->decoder).remember_unknown_chunks = 0;
  (state->decoder).zlibsettings.ignore_adler32 = 0;
  (state->decoder).ignore_end = 0;
  (state->decoder).color_convert = 1;
  (state->decoder).zlibsettings.custom_zlib =
       (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0;
  (state->decoder).zlibsettings.custom_inflate =
       (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0;
  (state->decoder).zlibsettings.custom_context = (void *)0x0;
  (state->decoder).ignore_crc = 0;
  (state->decoder).ignore_critical = 0;
  lodepng_encoder_settings_init(&state->encoder);
  (state->info_raw).key_defined = 0;
  (state->info_raw).key_r = 0;
  (state->info_raw).key_g = 0;
  (state->info_raw).key_b = 0;
  (state->info_raw).colortype = LCT_RGBA;
  (state->info_raw).bitdepth = 8;
  (state->info_raw).palette = (uchar *)0x0;
  (state->info_raw).palettesize = 0;
  lodepng_info_init(&state->info_png);
  state->error = 1;
  return;
}

Assistant:

void lodepng_state_init(LodePNGState* state)
{
#ifdef LODEPNG_COMPILE_DECODER
  lodepng_decoder_settings_init(&state->decoder);
#endif /*LODEPNG_COMPILE_DECODER*/
#ifdef LODEPNG_COMPILE_ENCODER
  lodepng_encoder_settings_init(&state->encoder);
#endif /*LODEPNG_COMPILE_ENCODER*/
  lodepng_color_mode_init(&state->info_raw);
  lodepng_info_init(&state->info_png);
  state->error = 1;
}